

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O1

string * __thiscall cfd::core::Psbt::GetBase64_abi_cxx11_(string *__return_storage_ptr__,Psbt *this)

{
  ByteData *data;
  ByteData local_28;
  
  GetData(&local_28,this);
  CryptoUtil::EncodeBase64_abi_cxx11_((string *)__return_storage_ptr__,(CryptoUtil *)&local_28,data)
  ;
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Psbt::GetBase64() const {
  return CryptoUtil::EncodeBase64(GetData());
}